

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
CDBWrapper::ReadImpl_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CDBWrapper *this,Span<const_std::byte> key)

{
  long lVar1;
  DB *pDVar2;
  LevelDBContext *pLVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  Status status;
  Slice slKey;
  string local_60;
  string strValue;
  
  slKey.size_ = key.m_size;
  slKey.data_ = (char *)key.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  strValue._M_dataplus._M_p = (pointer)&strValue.field_2;
  strValue._M_string_length = 0;
  strValue.field_2._M_local_buf[0] = '\0';
  pLVar3 = DBContext(this);
  pDVar2 = pLVar3->pdb;
  pLVar3 = DBContext(this);
  (*pDVar2->_vptr_DB[5])(&status,pDVar2,&pLVar3->readoptions,&slKey,&strValue);
  if (status.state_ != (char *)0x0) {
    if (status.state_[4] == '\x01') {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      goto LAB_006c32b4;
    }
    leveldb::Status::ToString_abi_cxx11_(&local_60,&status);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
    ;
    source_file._M_len = 0x5d;
    logging_function._M_str = "ReadImpl";
    logging_function._M_len = 8;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x15a,ALL,Info,(ConstevalFormatString<1U>)0xc8d3f1,
               &local_60);
    std::__cxx11::string::~string((string *)&local_60);
    HandleError(&status);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,&strValue);
LAB_006c32b4:
  leveldb::Status::~Status(&status);
  std::__cxx11::string::~string((string *)&strValue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> CDBWrapper::ReadImpl(Span<const std::byte> key) const
{
    leveldb::Slice slKey(CharCast(key.data()), key.size());
    std::string strValue;
    leveldb::Status status = DBContext().pdb->Get(DBContext().readoptions, slKey, &strValue);
    if (!status.ok()) {
        if (status.IsNotFound())
            return std::nullopt;
        LogPrintf("LevelDB read failure: %s\n", status.ToString());
        HandleError(status);
    }
    return strValue;
}